

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demoend_playground.cpp
# Opt level: O2

void __thiscall cdplayer::add_transitions(cdplayer *this,state_machine<cdplayer> *sm)

{
  state_conditions *psVar1;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  
  (sm->state_switches_)._M_elems[0].switch_conditions_m.from_state_m = off;
  (sm->state_switches_)._M_elems[0].switch_conditions_m.current_switch_to_state_m = on;
  (sm->state_switches_)._M_elems[0].switch_conditions_m.state_machine_m = (state_machine_type *)sm;
  local_50 = power_toggle;
  local_48 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (&(sm->state_switches_)._M_elems[0].switch_conditions_m,
                      (sm_condition_memfun *)&local_50);
  estl::state_machine<cdplayer>::state_conditions::otherwise_loop(psVar1);
  (sm->state_switches_)._M_elems[1].switch_conditions_m.from_state_m = on;
  (sm->state_switches_)._M_elems[1].switch_conditions_m.current_switch_to_state_m = off;
  (sm->state_switches_)._M_elems[1].switch_conditions_m.state_machine_m = (state_machine_type *)sm;
  local_50 = power_toggle;
  local_48 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (&(sm->state_switches_)._M_elems[1].switch_conditions_m,
                      (sm_condition_memfun *)&local_50);
  psVar1->current_switch_to_state_m = playing;
  local_40 = play_pressed;
  local_38 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (psVar1,(sm_condition_memfun *)&local_40);
  estl::state_machine<cdplayer>::state_conditions::otherwise_loop(psVar1);
  (sm->state_switches_)._M_elems[2].switch_conditions_m.from_state_m = playing;
  (sm->state_switches_)._M_elems[2].switch_conditions_m.current_switch_to_state_m = off;
  (sm->state_switches_)._M_elems[2].switch_conditions_m.state_machine_m = (state_machine_type *)sm;
  local_50 = power_toggle;
  local_48 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (&(sm->state_switches_)._M_elems[2].switch_conditions_m,
                      (sm_condition_memfun *)&local_50);
  psVar1->current_switch_to_state_m = paused;
  local_40 = play_pressed;
  local_38 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (psVar1,(sm_condition_memfun *)&local_40);
  estl::state_machine<cdplayer>::state_conditions::otherwise_loop(psVar1);
  (sm->state_switches_)._M_elems[3].switch_conditions_m.from_state_m = paused;
  (sm->state_switches_)._M_elems[3].switch_conditions_m.current_switch_to_state_m = off;
  (sm->state_switches_)._M_elems[3].switch_conditions_m.state_machine_m = (state_machine_type *)sm;
  local_50 = power_toggle;
  local_48 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (&(sm->state_switches_)._M_elems[3].switch_conditions_m,
                      (sm_condition_memfun *)&local_50);
  psVar1->current_switch_to_state_m = playing;
  local_40 = play_pressed;
  local_38 = 0;
  psVar1 = estl::state_machine<cdplayer>::state_conditions::when
                     (psVar1,(sm_condition_memfun *)&local_40);
  estl::state_machine<cdplayer>::state_conditions::otherwise_loop(psVar1);
  return;
}

Assistant:

void add_transitions(estl::state_machine<cdplayer>& sm)
    {
        // --- Transitions from off ---
        sm.transitions_from(state_type::off)
                .switch_to(state_type::on).when(&cdplayer::power_toggle)
                .otherwise_loop();

        // --- Transitions from on ---
        sm.transitions_from(state_type::on)
                .switch_to(state_type::off).when(&cdplayer::power_toggle)
                .switch_to(state_type::playing).when(&cdplayer::play_pressed)
                .otherwise_loop();

        // --- Transitions from playing ---
        sm.transitions_from(state_type::playing)
                .switch_to(state_type::off).when(&cdplayer::power_toggle)
                .switch_to(state_type::paused).when(&cdplayer::play_pressed)
                .otherwise_loop();

        // --- Transitions from paused ---
        sm.transitions_from(state_type::paused)
                .switch_to(state_type::off).when(&cdplayer::power_toggle)
                .switch_to(state_type::playing).when(&cdplayer::play_pressed)
                .otherwise_loop();
    }